

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O2

_Bool rc_shift_low(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar2 = rc->low;
  if (uVar2 >> 0x18 == 0xff) {
    uVar3 = rc->cache_size + 1;
  }
  else {
    do {
      if (*out_pos == out_size) {
        return true;
      }
      out[*out_pos] = rc->cache + *(char *)((long)&rc->low + 4);
      *out_pos = *out_pos + 1;
      rc->cache = 0xff;
      puVar1 = &rc->cache_size;
      *puVar1 = *puVar1 - 1;
    } while (*puVar1 != 0);
    uVar2 = rc->low;
    rc->cache = (uint8_t)(uVar2 >> 0x18);
    uVar3 = 1;
  }
  rc->cache_size = uVar3;
  rc->low = (ulong)(uint)((int)uVar2 << 8);
  return false;
}

Assistant:

static inline bool
rc_shift_low(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	if ((uint32_t)(rc->low) < (uint32_t)(0xFF000000)
			|| (uint32_t)(rc->low >> 32) != 0) {
		do {
			if (*out_pos == out_size)
				return true;

			out[*out_pos] = rc->cache + (uint8_t)(rc->low >> 32);
			++*out_pos;
			rc->cache = 0xFF;

		} while (--rc->cache_size != 0);

		rc->cache = (rc->low >> 24) & 0xFF;
	}

	++rc->cache_size;
	rc->low = (rc->low & 0x00FFFFFF) << RC_SHIFT_BITS;

	return false;
}